

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O0

int convert_bsize_to_idx(BLOCK_SIZE bsize)

{
  BLOCK_SIZE bsize_local;
  int local_4;
  
  switch(bsize) {
  case BLOCK_8X8:
    local_4 = 4;
    break;
  default:
    local_4 = -1;
    break;
  case BLOCK_16X16:
    local_4 = 3;
    break;
  case BLOCK_32X32:
    local_4 = 2;
    break;
  case BLOCK_64X64:
    local_4 = 1;
    break;
  case BLOCK_128X128:
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static inline int convert_bsize_to_idx(BLOCK_SIZE bsize) {
  switch (bsize) {
    case BLOCK_128X128: return 0;
    case BLOCK_64X64: return 1;
    case BLOCK_32X32: return 2;
    case BLOCK_16X16: return 3;
    case BLOCK_8X8: return 4;
    default: assert(0 && "Invalid bsize"); return -1;
  }
}